

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

void __thiscall
glslang::TReflectionTraverser::getOffsets
          (TReflectionTraverser *this,TType *type,TVector<int> *offsets)

{
  int iVar1;
  TTypeList *pTVar2;
  pointer piVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  ulong uVar5;
  int offset;
  int memberSize;
  int local_38;
  int local_34;
  
  pTVar2 = TType::getStruct(type);
  local_38 = 0;
  local_34 = 0;
  piVar3 = (offsets->super_vector<int,_glslang::pool_allocator<int>_>).
           super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar4 = 0;
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(offsets->super_vector<int,_glslang::pool_allocator<int>_>).
                            super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar3 >> 2);
      uVar5 = uVar5 + 1) {
    iVar1 = (*(&((pTVar2->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start)->type)[lVar4]->_vptr_TType[10])();
    if (*(int *)(CONCAT44(extraout_var,iVar1) + 0x14) != -1) {
      iVar1 = (*(&((pTVar2->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start)->type)[lVar4]->_vptr_TType[10])();
      local_38 = *(int *)(CONCAT44(extraout_var_00,iVar1) + 0x14);
    }
    TIntermediate::updateOffset
              (type,(&((pTVar2->
                       super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>)
                       .
                       super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                       ._M_impl.super__Vector_impl_data._M_start)->type)[lVar4],&local_38,&local_34)
    ;
    piVar3 = (offsets->super_vector<int,_glslang::pool_allocator<int>_>).
             super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    *(int *)((long)piVar3 + lVar4) = local_38;
    local_38 = local_38 + local_34;
    lVar4 = lVar4 + 4;
  }
  return;
}

Assistant:

void getOffsets(const TType& type, TVector<int>& offsets)
    {
        const TTypeList& memberList = *type.getStruct();
        int memberSize = 0;
        int offset = 0;

        for (size_t m = 0; m < offsets.size(); ++m) {
            // if the user supplied an offset, snap to it now
            if (memberList[m].type->getQualifier().hasOffset())
                offset = memberList[m].type->getQualifier().layoutOffset;

            // calculate the offset of the next member and align the current offset to this member
            intermediate.updateOffset(type, *memberList[m].type, offset, memberSize);

            // save the offset of this member
            offsets[m] = offset;

            // update for the next member
            offset += memberSize;
        }
    }